

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O0

void emit_dac(j_compress_ptr cinfo)

{
  jpeg_component_info *pjVar1;
  jpeg_component_info *compptr;
  int i;
  int length;
  char ac_in_use [16];
  char dc_in_use [16];
  j_compress_ptr cinfo_local;
  
  for (compptr._0_4_ = 0; (int)compptr < 0x10; compptr._0_4_ = (int)compptr + 1) {
    *(undefined1 *)((long)&i + (long)(int)compptr) = 0;
    ac_in_use[(long)(int)compptr + 8] = '\0';
  }
  for (compptr._0_4_ = 0; (int)compptr < cinfo->comps_in_scan; compptr._0_4_ = (int)compptr + 1) {
    pjVar1 = cinfo->cur_comp_info[(int)compptr];
    if ((cinfo->Ss == 0) && (cinfo->Ah == 0)) {
      ac_in_use[(long)pjVar1->dc_tbl_no + 8] = '\x01';
    }
    if (cinfo->Se != 0) {
      *(undefined1 *)((long)&i + (long)pjVar1->ac_tbl_no) = 1;
    }
  }
  compptr._4_4_ = 0;
  for (compptr._0_4_ = 0; (int)compptr < 0x10; compptr._0_4_ = (int)compptr + 1) {
    compptr._4_4_ =
         (int)ac_in_use[(long)(int)compptr + 8] + (int)*(char *)((long)&i + (long)(int)compptr) +
         compptr._4_4_;
  }
  if (compptr._4_4_ != 0) {
    emit_marker(cinfo,M_DAC);
    emit_2bytes(cinfo,compptr._4_4_ * 2 + 2);
    for (compptr._0_4_ = 0; (int)compptr < 0x10; compptr._0_4_ = (int)compptr + 1) {
      if (ac_in_use[(long)(int)compptr + 8] != '\0') {
        emit_byte(cinfo,(int)compptr);
        emit_byte(cinfo,(uint)cinfo->arith_dc_L[(int)compptr] +
                        (uint)cinfo->arith_dc_U[(int)compptr] * 0x10);
      }
      if (*(char *)((long)&i + (long)(int)compptr) != '\0') {
        emit_byte(cinfo,(int)compptr + 0x10);
        emit_byte(cinfo,(uint)cinfo->arith_ac_K[(int)compptr]);
      }
    }
  }
  return;
}

Assistant:

LOCAL(void)
emit_dac (j_compress_ptr cinfo)
/* Emit a DAC marker */
/* Since the useful info is so small, we want to emit all the tables in */
/* one DAC marker.  Therefore this routine does its own scan of the table. */
{
#ifdef C_ARITH_CODING_SUPPORTED
  char dc_in_use[NUM_ARITH_TBLS];
  char ac_in_use[NUM_ARITH_TBLS];
  int length, i;
  jpeg_component_info *compptr;

  for (i = 0; i < NUM_ARITH_TBLS; i++)
    dc_in_use[i] = ac_in_use[i] = 0;

  for (i = 0; i < cinfo->comps_in_scan; i++) {
    compptr = cinfo->cur_comp_info[i];
    /* DC needs no table for refinement scan */
    if (cinfo->Ss == 0 && cinfo->Ah == 0)
      dc_in_use[compptr->dc_tbl_no] = 1;
    /* AC needs no table when not present */
    if (cinfo->Se)
      ac_in_use[compptr->ac_tbl_no] = 1;
  }

  length = 0;
  for (i = 0; i < NUM_ARITH_TBLS; i++)
    length += dc_in_use[i] + ac_in_use[i];

  if (length) {
    emit_marker(cinfo, M_DAC);

    emit_2bytes(cinfo, length*2 + 2);

    for (i = 0; i < NUM_ARITH_TBLS; i++) {
      if (dc_in_use[i]) {
	emit_byte(cinfo, i);
	emit_byte(cinfo, cinfo->arith_dc_L[i] + (cinfo->arith_dc_U[i]<<4));
      }
      if (ac_in_use[i]) {
	emit_byte(cinfo, i + 0x10);
	emit_byte(cinfo, cinfo->arith_ac_K[i]);
      }
    }
  }
#endif /* C_ARITH_CODING_SUPPORTED */
}